

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUMPU9250.cpp
# Opt level: O2

bool __thiscall RTIMUMPU9250::setAccelLpf(RTIMUMPU9250 *this,uchar lpf)

{
  bool bVar1;
  uint uVar2;
  undefined7 in_register_00000031;
  
  uVar2 = (uint)CONCAT71(in_register_00000031,lpf);
  if ((uVar2 < 9) && (uVar2 != 7)) {
    this->m_accelLpf = lpf;
    bVar1 = true;
  }
  else {
    bVar1 = false;
    fprintf(_stderr,"Illegal MPU9250 accel lpf %d\n",(ulong)lpf);
  }
  return bVar1;
}

Assistant:

bool RTIMUMPU9250::setAccelLpf(unsigned char lpf)
{
    switch (lpf) {
    case MPU9250_ACCEL_LPF_1130:
    case MPU9250_ACCEL_LPF_460:
    case MPU9250_ACCEL_LPF_184:
    case MPU9250_ACCEL_LPF_92:
    case MPU9250_ACCEL_LPF_41:
    case MPU9250_ACCEL_LPF_20:
    case MPU9250_ACCEL_LPF_10:
    case MPU9250_ACCEL_LPF_5:
        m_accelLpf = lpf;
        return true;

    default:
        HAL_ERROR1("Illegal MPU9250 accel lpf %d\n", lpf);
        return false;
    }
}